

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser.cpp
# Opt level: O2

shared_ptr<chatra::Node> __thiscall chatra::createNullNode(chatra *this,Token *templateToken)

{
  undefined1 *puVar1;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  shared_ptr<chatra::Node> sVar2;
  Token *local_20;
  
  std::make_shared<chatra::Node>();
  puVar1 = *(undefined1 **)this;
  *puVar1 = 0x1b;
  local_20 = templateToken;
  std::vector<chatra::Token_const*,std::allocator<chatra::Token_const*>>::
  emplace_back<chatra::Token_const*>
            ((vector<chatra::Token_const*,std::allocator<chatra::Token_const*>> *)(puVar1 + 0x18),
             &local_20);
  *(undefined4 *)(*(long *)this + 0x34) = 0x68;
  sVar2.super___shared_ptr<chatra::Node,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       extraout_RDX._M_pi;
  sVar2.super___shared_ptr<chatra::Node,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)this;
  return (shared_ptr<chatra::Node>)
         sVar2.super___shared_ptr<chatra::Node,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

static std::shared_ptr<Node> createNullNode(const Token& templateToken) {
	auto n = std::make_shared<Node>();
	n->type = NodeType::Name;
	n->tokens.push_back(&templateToken);
	n->sid = StringId::Null;
	return n;
}